

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase1523::run(TestCase1523 *this)

{
  SegmentBuilder *pSVar1;
  bool bVar2;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar3;
  ReaderOptions options;
  MallocMessageBuilder copy;
  SegmentArrayMessageReader reader;
  MallocMessageBuilder builder;
  undefined1 local_498 [32];
  NullableValue<kj::Exception> local_478;
  MallocMessageBuilder local_318;
  undefined1 local_228 [240];
  undefined1 local_138 [24];
  int local_120;
  MallocMessageBuilder local_110;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_110,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)local_228,&local_110.super_MessageBuilder);
  local_318.super_MessageBuilder.arenaSpace[1] = (void *)local_228._16_8_;
  local_318.super_MessageBuilder._vptr_MessageBuilder = (_func_int **)local_228._0_8_;
  local_318.super_MessageBuilder.arenaSpace[0] = (void *)local_228._8_8_;
  PointerBuilder::initStruct
            ((StructBuilder *)&local_478,(PointerBuilder *)&local_318,(StructSize)0x10000);
  local_228._0_8_ = local_478._0_8_;
  local_228._16_8_ = local_478.field_1.value.ownFile.content.disposer;
  PointerBuilder::initList((ListBuilder *)&local_318,(PointerBuilder *)local_228,VOID,0x10000000);
  AVar3 = MessageBuilder::getSegmentsForOutput(&local_110.super_MessageBuilder);
  if ((SegmentBuilder *)AVar3.size_ != (SegmentBuilder *)0x1 && kj::_::Debug::minSeverity < 3) {
    local_318.super_MessageBuilder._vptr_MessageBuilder =
         (_func_int **)CONCAT44(local_318.super_MessageBuilder._vptr_MessageBuilder._4_4_,1);
    local_478._0_8_ = (SegmentBuilder *)AVar3.size_;
    kj::_::Debug::log<char_const(&)[42],int,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x5f8,ERROR,"\"failed: expected \" \"(1) == (segments.size())\", 1, segments.size()"
               ,(char (*) [42])"failed: expected (1) == (segments.size())",(int *)&local_318,
               (unsigned_long *)&local_478);
  }
  pSVar1 = (SegmentBuilder *)(AVar3.ptr)->size_;
  if (((SegmentBuilder *)0xf < pSVar1) && (kj::_::Debug::minSeverity < 3)) {
    local_318.super_MessageBuilder._vptr_MessageBuilder =
         (_func_int **)CONCAT44(local_318.super_MessageBuilder._vptr_MessageBuilder._4_4_,0x10);
    local_478._0_8_ = pSVar1;
    kj::_::Debug::log<char_const(&)[45],unsigned_long,int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x5f9,ERROR,
               "\"failed: expected \" \"(segments[0].size()) < (16)\", segments[0].size(), 16",
               (char (*) [45])"failed: expected (segments[0].size()) < (16)",
               (unsigned_long *)&local_478,(int *)&local_318);
  }
  AVar3 = MessageBuilder::getSegmentsForOutput(&local_110.super_MessageBuilder);
  options._8_8_ = 0x40;
  options.traversalLimitInWords = 0x800000;
  SegmentArrayMessageReader::SegmentArrayMessageReader
            ((SegmentArrayMessageReader *)local_228,AVar3,options);
  MessageReader::getRootInternal((Reader *)local_498,(MessageReader *)local_228);
  local_318.super_MessageBuilder.arenaSpace[1] = (void *)local_498._16_8_;
  local_318.super_MessageBuilder.arenaSpace[2] = (void *)local_498._24_8_;
  local_318.super_MessageBuilder._vptr_MessageBuilder = (_func_int **)local_498._0_8_;
  local_318.super_MessageBuilder.arenaSpace[0] = (void *)local_498._8_8_;
  PointerReader::getStruct((StructReader *)&local_478,(PointerReader *)&local_318,(word *)0x0);
  bVar2 = local_478.field_1._28_2_ != 0;
  local_138._16_8_ = (WirePointer *)0x0;
  if (bVar2) {
    local_138._16_8_ = local_478.field_1.value.ownFile.content.disposer;
  }
  local_120 = 0x7fffffff;
  if (bVar2) {
    local_120 = local_478.field_1.value.line;
  }
  local_138[0] = false;
  local_138._1_3_ = 0;
  local_138._4_4_ = 0;
  local_138._8_4_ = 0;
  local_138._12_4_ = 0;
  if (bVar2) {
    local_138._0_4_ = local_478._0_4_;
    local_138._4_4_ = local_478._4_4_;
    local_138._8_4_ = local_478.field_1._0_4_;
    local_138._12_4_ = local_478.field_1._4_4_;
  }
  local_318.super_MessageBuilder.arenaSpace[0] = local_138;
  local_318.super_MessageBuilder._vptr_MessageBuilder = (_func_int **)&PTR_run_0036c360;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&local_478,(Runnable *)&local_318);
  if (local_478.isSet == true) {
    kj::Exception::~Exception(&local_478.field_1.value);
  }
  else if (kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[99]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x5fd,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAs<List<TestAllTypes>>(); }) != nullptr\""
               ,(char (*) [99])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAs<List<TestAllTypes>>(); }) != nullptr"
              );
  }
  MallocMessageBuilder::MallocMessageBuilder(&local_318,0x400,GROW_HEURISTICALLY);
  local_498._0_8_ = &PTR_run_0036c390;
  local_498._8_8_ = &local_318;
  local_498._16_8_ = (MessageReader *)local_228;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&local_478,(Runnable *)local_498);
  if (local_478.isSet == true) {
    kj::Exception::~Exception(&local_478.field_1.value);
  }
  else if (kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[109]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x600,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { copy.setRoot(reader.getRoot<AnyPointer>()); }) != nullptr\""
               ,(char (*) [109])
                "failed: expected kj::runCatchingExceptions([&]() { copy.setRoot(reader.getRoot<AnyPointer>()); }) != nullptr"
              );
  }
  MallocMessageBuilder::~MallocMessageBuilder(&local_318);
  SegmentArrayMessageReader::~SegmentArrayMessageReader((SegmentArrayMessageReader *)local_228);
  MallocMessageBuilder::~MallocMessageBuilder(&local_110);
  return;
}

Assistant:

TEST(Encoding, VoidListAmplification) {
  MallocMessageBuilder builder;
  builder.initRoot<test::TestAnyPointer>().getAnyPointerField().initAs<List<Void>>(1u << 28);

  auto segments = builder.getSegmentsForOutput();
  EXPECT_EQ(1, segments.size());
  EXPECT_LT(segments[0].size(), 16);  // quite small for such a big list!

  SegmentArrayMessageReader reader(builder.getSegmentsForOutput());
  auto root = reader.getRoot<test::TestAnyPointer>().getAnyPointerField();
  EXPECT_NONFATAL_FAILURE(root.getAs<List<TestAllTypes>>());

  MallocMessageBuilder copy;
  EXPECT_NONFATAL_FAILURE(copy.setRoot(reader.getRoot<AnyPointer>()));
}